

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

bool __thiscall
DListBase<Js::RecyclableObject_*,_RealCount>::Append<Memory::HeapAllocator>
          (DListBase<Js::RecyclableObject_*,_RealCount> *this,HeapAllocator *allocator,
          RecyclableObject **data)

{
  HeapAllocator *alloc;
  DListNode<Js::RecyclableObject_*> *this_00;
  DListNodeBase<Js::RecyclableObject_*> **ppDVar1;
  TrackAllocData local_58;
  DListNode<Js::RecyclableObject_*> *local_30;
  Node *newNode;
  RecyclableObject **data_local;
  HeapAllocator *allocator_local;
  DListBase<Js::RecyclableObject_*,_RealCount> *this_local;
  
  newNode = (Node *)data;
  data_local = (RecyclableObject **)allocator;
  allocator_local = (HeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&DListNode<Js::RecyclableObject*>::typeinfo,0,0xffffffffffffffff
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0xf0);
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,&local_58);
  this_00 = (DListNode<Js::RecyclableObject_*> *)new<Memory::HeapAllocator>(0x18,alloc,0x350bd0);
  DListNode<Js::RecyclableObject_*>::DListNode(this_00,(RecyclableObject **)newNode);
  if (this_00 != (DListNode<Js::RecyclableObject_*> *)0x0) {
    local_30 = this_00;
    ppDVar1 = DListNodeBase<Js::RecyclableObject_*>::Prev
                        (&this->super_DListNodeBase<Js::RecyclableObject_*>);
    InsertNodeAfter(*ppDVar1,&local_30->super_DListNodeBase<Js::RecyclableObject_*>);
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 != (DListNode<Js::RecyclableObject_*> *)0x0;
}

Assistant:

bool Append(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            DListBase::InsertNodeAfter(this->Prev(), newNode);
            this->IncrementCount();
            return true;
        }
        return false;
    }